

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

ssize_t __thiscall MemIStream::read(MemIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 unaff_RBP;
  undefined4 in_register_00000034;
  pointer __src;
  
  __src = (this->ostream->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start + this->streamptr;
  iVar1 = *(int *)&(this->ostream->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)__src;
  iVar3 = (int)__buf;
  iVar2 = iVar1;
  if (iVar3 <= iVar1) {
    iVar2 = iVar3;
  }
  memcpy((void *)CONCAT44(in_register_00000034,__fd),__src,(long)iVar2);
  this->streamptr = this->streamptr + (long)iVar3;
  return CONCAT71((int7)((ulong)unaff_RBP >> 8),iVar1 < iVar3) & 0xffffffff;
}

Assistant:

bool read (char c[], int n) override
    {
        int bytesToRead =
            min (n, static_cast<int> (ostream.data.size () - streamptr));
        memcpy (c, ostream.data.data () + streamptr, bytesToRead);
        streamptr += n;
        return bytesToRead < n;
    }